

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O3

MPP_RET set_output_frame(Av1CodecContext *ctx)

{
  UINT32 UVar1;
  MppFrameHdrDynamicMeta *v;
  RK_S64 v_00;
  uint uVar2;
  MppFrame frame;
  MppFrame local_10;
  ulong uVar3;
  
  local_10 = (MppFrame)0x0;
  UVar1 = ctx[2].pic_params.tiles.tile_offset_start[0xd];
  if (UVar1 != 0) {
    uVar2 = mpp_log2((int)UVar1 >> 8);
    uVar3 = (ulong)uVar2;
    if (ctx[1].pic_params.frame_ref_state[2].frame_height < (int)uVar2) goto LAB_001bc925;
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)(ctx[0x24].pic_params.ref_order_hint + 5),
             ctx[1].pic_params.frame_ref_state[1].order_hint,SLOT_FRAME_PTR,&local_10);
  v = *(MppFrameHdrDynamicMeta **)(ctx[2].pic_params.tiles.tile_offset_start + 7);
  if ((v != (MppFrameHdrDynamicMeta *)0x0) && (ctx[2].pic_params.tiles.tile_offset_start[9] != 0)) {
    mpp_frame_set_hdr_dynamic_meta(local_10,v);
    ctx[2].pic_params.tiles.tile_offset_start[9] = 0;
    if (**(char **)((ctx->pic_params).tiles.widths + 3) != '\0') {
      fill_hdr_meta_to_frame(local_10,MPP_VIDEO_CodingAV1);
    }
  }
  v_00._0_4_ = ctx[0x24].pic_params.frame_refs[0].alt_frame_offset;
  v_00._4_4_ = ctx[0x24].pic_params.frame_refs[0].is_intra_frame;
  mpp_frame_set_pts(local_10,v_00);
  mpp_buf_slot_set_flag
            (*(MppBufSlots *)(ctx[0x24].pic_params.ref_order_hint + 5),
             ctx[1].pic_params.frame_ref_state[1].order_hint,SLOT_QUEUE_USE);
  mpp_buf_slot_enqueue
            (*(MppBufSlots *)(ctx[0x24].pic_params.ref_order_hint + 5),
             ctx[1].pic_params.frame_ref_state[1].order_hint,QUEUE_DISPLAY);
  uVar3 = *(ulong *)(ctx[2].pic_params.tiles.heights + 0x3b);
  *(undefined4 *)(uVar3 + 8) = 1;
LAB_001bc925:
  return (MPP_RET)uVar3;
}

Assistant:

static MPP_RET set_output_frame(Av1CodecContext *ctx)
{
    AV1Context *s = ctx->priv_data;
    MppFrame frame = NULL;
    MPP_RET ret = MPP_OK;

    // TODO: all layers
    if (s->operating_point_idc &&
        mpp_log2(s->operating_point_idc >> 8) > s->cur_frame.spatial_id)
        return 0;
    mpp_buf_slot_get_prop(s->slots, s->cur_frame.slot_index, SLOT_FRAME_PTR, &frame);
    if (s->hdr_dynamic_meta && s->hdr_dynamic) {
        mpp_frame_set_hdr_dynamic_meta(frame, s->hdr_dynamic_meta);
        s->hdr_dynamic = 0;
        if (s->raw_frame_header->show_existing_frame)
            fill_hdr_meta_to_frame(frame, MPP_VIDEO_CodingAV1);
    }
    mpp_frame_set_pts(frame, s->pts);
    mpp_buf_slot_set_flag(s->slots, s->cur_frame.slot_index, SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(s->slots, s->cur_frame.slot_index, QUEUE_DISPLAY);
    s->cur_frame.ref->is_output = 1;

    return ret;
}